

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_ubo_reference.cpp
# Opt level: O1

ir_expression * __thiscall
anon_unknown.dwarf_7c5df::lower_ubo_reference_visitor::calculate_ssbo_unsized_array_length
          (lower_ubo_reference_visitor *this,ir_expression *expr)

{
  ir_node_type iVar1;
  ir_rvalue *deref;
  int iVar2;
  undefined4 extraout_var;
  ir_expression *piVar3;
  ir_rvalue *rvalue;
  ir_rvalue *local_18;
  ir_variable *var;
  
  if (expr->operation != ir_unop_ssbo_unsized_array_length) {
    return (ir_expression *)0x0;
  }
  deref = expr->operands[0];
  iVar1 = (((ir_rvalue *)&deref->super_ir_instruction)->super_ir_instruction).ir_type;
  local_18 = (ir_rvalue *)0x0;
  if (iVar1 < ir_type_variable) {
    local_18 = deref;
  }
  if ((((local_18 != (ir_rvalue *)0x0) && (local_18->type->field_0x4 == '\x11')) &&
      (local_18->type->length == 0)) && (deref != (ir_rvalue *)0x0 && iVar1 < ir_type_constant)) {
    iVar2 = (*(((ir_rvalue *)&deref->super_ir_instruction)->super_ir_instruction).
              _vptr_ir_instruction[8])(deref);
    var = (ir_variable *)CONCAT44(extraout_var,iVar2);
    if (var != (ir_variable *)0x0) {
      if (((undefined1  [44])var->data & (undefined1  [44])0xf000) != (undefined1  [44])0x2000) {
        return (ir_expression *)0x0;
      }
      if (var->interface_type != (glsl_type *)0x0) {
        piVar3 = process_ssbo_unsized_array_length(this,&local_18,(ir_dereference *)deref,var);
        return piVar3;
      }
      return (ir_expression *)0x0;
    }
  }
  return (ir_expression *)0x0;
}

Assistant:

ir_expression *
lower_ubo_reference_visitor::calculate_ssbo_unsized_array_length(ir_expression *expr)
{
   if (expr->operation !=
       ir_expression_operation(ir_unop_ssbo_unsized_array_length))
      return NULL;

   ir_rvalue *rvalue = expr->operands[0]->as_rvalue();
   if (!rvalue ||
       !rvalue->type->is_array() || !rvalue->type->is_unsized_array())
      return NULL;

   ir_dereference *deref = expr->operands[0]->as_dereference();
   if (!deref)
      return NULL;

   ir_variable *var = expr->operands[0]->variable_referenced();
   if (!var || !var->is_in_shader_storage_block())
      return NULL;
   return process_ssbo_unsized_array_length(&rvalue, deref, var);
}